

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
duckdb_re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  uint uVar1;
  _Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> _Var2;
  Inst *pIVar3;
  IndexValue *pIVar4;
  pointer pvVar5;
  Deleter *pDVar6;
  IndexValue *pIVar7;
  Deleter *pDVar8;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  _Var9;
  int *piVar11;
  Deleter *pDVar12;
  iterator iVar13;
  int *piVar14;
  Deleter *pDVar15;
  int iVar16;
  Deleter local_48;
  anon_union_4_5_a14c903b_for_Inst_2 local_44;
  SparseArray<int> *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  uint uVar10;
  
  reachable->size_ = 0;
  piVar11 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  iVar13._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar13._M_current != piVar11) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar11;
    iVar13._M_current = piVar11;
  }
  local_48.len_ = root;
  local_38 = predvec;
  if (iVar13._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar13,&local_48.len_);
    piVar11 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    piVar14 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  else {
    *iVar13._M_current = root;
    piVar14 = iVar13._M_current + 1;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar14;
  }
  local_40 = predmap;
  if (piVar11 == piVar14) {
    pDVar8 = (Deleter *)
             (reachable->dense_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
LAB_0183cd2a:
    iVar16 = reachable->size_;
    if (iVar16 != 0) {
      pIVar4 = (local_40->dense_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
               _M_head_impl;
      pDVar12 = pDVar8;
      do {
        if ((pIVar4 != (IndexValue *)0x0) &&
           (_Var9._M_head_impl.len_ = (Deleter)pDVar12->len_,
           (uint)_Var9._M_head_impl.len_ <
           (uint)*(int *)&(local_40->dense_).ptr_._M_t.
                          super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                          .
                          super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                          .
                          super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
           )) {
          uVar10 = (local_40->sparse_).ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)_Var9._M_head_impl.len_];
          if ((uVar10 < (uint)local_40->size_) &&
             ((Deleter)pIVar4[(int)uVar10].index_ == _Var9._M_head_impl.len_)) {
            pvVar5 = (local_38->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pDVar15 = *(Deleter **)
                       &pvVar5[pIVar4[(int)uVar10].value_].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
            pDVar6 = *(Deleter **)
                      ((long)&pvVar5[pIVar4[(int)uVar10].value_].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            if (pDVar15 != pDVar6) {
              do {
                if (((((pDVar8 == (Deleter *)0x0) ||
                      (_Var2._M_head_impl.len_ = (Deleter)pDVar15->len_,
                      (uint)*(int *)&(reachable->dense_).ptr_._M_t.
                                     super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>
                                     .super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                                     super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>
                      <= (uint)_Var2._M_head_impl.len_)) ||
                     (uVar10 = (reachable->sparse_).ptr_._M_t.
                               super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl
                               [(int)_Var2._M_head_impl.len_], (uint)reachable->size_ <= uVar10)) ||
                    ((Deleter)pDVar8[(int)uVar10].len_ != _Var2._M_head_impl.len_)) &&
                   ((pIVar7 = (rootmap->dense_).ptr_._M_t.
                              super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                              .
                              super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>
                              ._M_head_impl, pIVar7 != (IndexValue *)0x0 &&
                    ((uint)_Var9._M_head_impl.len_ <
                     (uint)*(int *)&(rootmap->dense_).ptr_._M_t.
                                    super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                    .
                                    super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                    .
                                    super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
                    )))) {
                  piVar11 = (rootmap->sparse_).ptr_._M_t.
                            super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                            super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl;
                  uVar10 = rootmap->size_;
                  if ((uVar10 <= (uint)piVar11[(int)_Var9._M_head_impl.len_]) ||
                     ((Deleter)pIVar7[piVar11[(int)_Var9._M_head_impl.len_]].index_ !=
                      _Var9._M_head_impl.len_)) {
                    piVar11[(int)_Var9._M_head_impl.len_] = uVar10;
                    pIVar7[(int)uVar10].index_ = (int)_Var9._M_head_impl.len_;
                    rootmap->size_ = uVar10 + 1;
                    pIVar7[piVar11[(int)_Var9._M_head_impl.len_]].value_ = uVar10;
                  }
                }
                pDVar15 = pDVar15 + 1;
              } while (pDVar15 != pDVar6);
              iVar16 = reachable->size_;
            }
          }
        }
        pDVar12 = pDVar12 + 1;
      } while (pDVar12 != pDVar8 + iVar16);
    }
    return;
  }
LAB_0183cc53:
  _Var9._M_head_impl.len_ = (Deleter)piVar14[-1];
  (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       piVar14 + -1;
  do {
    pDVar8 = (Deleter *)
             (reachable->dense_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if ((pDVar8 != (Deleter *)0x0) &&
       ((uint)_Var9._M_head_impl.len_ <
        (uint)*(int *)&(reachable->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>)) {
      piVar11 = (reachable->sparse_).ptr_._M_t.
                super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl;
      uVar10 = piVar11[(int)_Var9._M_head_impl.len_];
      uVar1 = reachable->size_;
      if ((uVar10 < uVar1) && ((Deleter)pDVar8[(int)uVar10].len_ == _Var9._M_head_impl.len_)) break;
      piVar11[(int)_Var9._M_head_impl.len_] = uVar1;
      pDVar8[(int)uVar1].len_ = (int)_Var9._M_head_impl.len_;
      reachable->size_ = reachable->size_ + 1;
    }
    if ((((_Var9._M_head_impl.len_ != (Deleter)local_48.len_) &&
         (pIVar4 = (rootmap->dense_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                   .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                   _M_head_impl, pIVar4 != (IndexValue *)0x0)) &&
        ((uint)_Var9._M_head_impl.len_ <
         (uint)*(int *)&(rootmap->dense_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
        )) && ((uVar10 = (rootmap->sparse_).ptr_._M_t.
                         super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl
                         [(int)_Var9._M_head_impl.len_], uVar10 < (uint)rootmap->size_ &&
               ((Deleter)pIVar4[(int)uVar10].index_ == _Var9._M_head_impl.len_)))) break;
    pIVar3 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar10 = pIVar3[(int)_Var9._M_head_impl.len_].out_opcode_;
    if ((3U >> (uVar10 & 7) & 1) == 0) {
      if ((uVar10 & 7) != 6) break;
    }
    else {
      local_44 = pIVar3[(int)_Var9._M_head_impl.len_].field_1;
      iVar13._M_current =
           (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar13._M_current ==
          (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar13,&local_44.cap_);
      }
      else {
        *iVar13._M_current = (int)local_44;
        (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar13._M_current + 1;
      }
      uVar10 = pIVar3[(int)_Var9._M_head_impl.len_].out_opcode_;
    }
    _Var9._M_head_impl.len_ = (Deleter)(uVar10 >> 4);
  } while( true );
  piVar14 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      == piVar14) goto LAB_0183cd2a;
  goto LAB_0183cc53;
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}